

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

string * __thiscall Kernel::Term::headToString_abi_cxx11_(Term *this)

{
  bool bVar1;
  SpecialFunctor SVar2;
  Combinator CVar3;
  uint uVar4;
  Symbol *this_00;
  string *psVar5;
  Term *in_RSI;
  string *in_RDI;
  AtomicSort *asSort;
  string name;
  bool print;
  uint proj;
  bool first;
  Iterator ss;
  Iterator vs;
  string varList;
  TermList lambdaExp;
  SList *sorts;
  VList *vars;
  Symbol *symbol;
  uint i_2;
  string typesList;
  string symbolsList;
  OperatorType *fnType;
  TermList binding_1;
  uint tupleFunctor;
  VList *symbols;
  uint i_1;
  Iterator tit;
  string termList;
  Term *term;
  uint var;
  uint i;
  string variablesList;
  VList *variables;
  OperatorType *type;
  string functor;
  bool isPredicate;
  TermList binding;
  string formula;
  SpecialTermData *sd;
  undefined8 in_stack_fffffffffffff788;
  Options *in_stack_fffffffffffff790;
  undefined5 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79d;
  undefined1 in_stack_fffffffffffff79e;
  undefined1 in_stack_fffffffffffff79f;
  allocator<char> *__rhs;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 uVar6;
  allocator<char> *in_stack_fffffffffffff7c0;
  Tuples *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  uint in_stack_fffffffffffff7d4;
  Tuples *in_stack_fffffffffffff7d8;
  uint in_stack_fffffffffffff8cc;
  allocator<char> local_6a9;
  string local_6a8 [39];
  undefined1 local_681;
  string local_680 [32];
  string local_660 [1608];
  SpecialTermData *local_18;
  
  uVar4 = (uint)((ulong)in_stack_fffffffffffff788 >> 0x20);
  bVar1 = isSpecial((Term *)0x9833ff);
  if (bVar1) {
    local_18 = getSpecialData((Term *)0x983415);
    SVar2 = specialFunctor((Term *)0x98342a);
    psVar5 = (string *)(*(code *)(&DAT_00efa878 + *(int *)(&DAT_00efa878 + (ulong)SVar2 * 4)))();
    return psVar5;
  }
  bVar1 = isSort((Term *)0x984bf8);
  if (!bVar1) {
    in_stack_fffffffffffff7c8 = Theory::tuples();
    in_stack_fffffffffffff7d4 = Term::functor(in_RSI);
    isLiteral((Term *)0x984c28);
    bVar1 = Theory::Tuples::findProjection
                      (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                       SUB41((uint)in_stack_fffffffffffff7d0 >> 0x18,0),
                       (uint *)in_stack_fffffffffffff7c8);
    if (bVar1) {
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff8cc);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffff79f,
                                      CONCAT16(in_stack_fffffffffffff79e,
                                               CONCAT15(in_stack_fffffffffffff79d,
                                                        in_stack_fffffffffffff798))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff790);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff79f,
                              CONCAT16(in_stack_fffffffffffff79e,
                                       CONCAT15(in_stack_fffffffffffff79d,in_stack_fffffffffffff798)
                                      )),(char *)in_stack_fffffffffffff790);
      std::__cxx11::string::~string(local_660);
      std::__cxx11::string::~string(local_680);
      return in_RDI;
    }
  }
  bVar1 = isLiteral((Term *)0x984d14);
  if ((!bVar1) && (bVar1 = isSort((Term *)0x984d25), !bVar1)) {
    this_00 = Signature::getFunction((Signature *)in_stack_fffffffffffff790,uVar4);
    CVar3 = Signature::Symbol::combinator(this_00);
    uVar6 = false;
    if (CVar3 != NOT_COMB) goto LAB_00984d70;
  }
  uVar4 = arity(in_RSI);
  uVar6 = uVar4 != 0;
LAB_00984d70:
  __rhs = &local_6a9;
  local_681 = uVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  std::allocator<char>::~allocator(&local_6a9);
  bVar1 = isLiteral((Term *)0x984dc4);
  if (bVar1) {
    psVar5 = Literal::predicateName_abi_cxx11_((Literal *)0x984de1);
    std::__cxx11::string::operator=(local_6a8,(string *)psVar5);
  }
  else {
    bVar1 = isSort((Term *)0x984e5a);
    if (bVar1) {
      bVar1 = Shell::Options::showFOOL(in_stack_fffffffffffff790);
      if ((bVar1) && (bVar1 = AtomicSort::isBoolSort((AtomicSort *)0x984ea9), bVar1)) {
        std::__cxx11::string::operator=(local_6a8,"$bool");
      }
      else {
        psVar5 = AtomicSort::typeConName_abi_cxx11_((AtomicSort *)0x984ede);
        std::__cxx11::string::operator=(local_6a8,(string *)psVar5);
      }
    }
    else {
      psVar5 = functionName_abi_cxx11_((Term *)0x984f0a);
      std::__cxx11::string::operator=(local_6a8,(string *)psVar5);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar6,in_stack_fffffffffffff7b8),(char *)__rhs);
  std::__cxx11::string::~string(local_6a8);
  return in_RDI;
}

Assistant:

std::string Term::headToString() const
{
  if (isSpecial()) {
    const Term::SpecialTermData* sd = getSpecialData();

    switch(specialFunctor()) {
      case SpecialFunctor::FORMULA: {
        ASS_EQ(arity(), 0);
        std::string formula = sd->getFormula()->toString();
        return env.options->showFOOL() ? "$term{" + formula + "}" : formula;
      }
      case SpecialFunctor::LET: {
        ASS_EQ(arity(), 1);
        TermList binding = sd->getBinding();
        bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
        std::string functor = isPredicate ? env.signature->predicateName(sd->getFunctor())
                                      : env.signature->functionName(sd->getFunctor());
        OperatorType* type = isPredicate ? env.signature->getPredicate(sd->getFunctor())->predType()
                                         : env.signature->getFunction(sd->getFunctor())->fnType();

        const VList* variables = sd->getVariables();
        std::string variablesList = "";
        for (unsigned i = 0; i < VList::length(variables); i++) {
          unsigned var = VList::nth(variables, i);
          variablesList += Term::variableToString(var);
          if (i < VList::length(variables) - 1) {
            variablesList += ", ";
          }
        }
        if (VList::length(variables)) {
          variablesList = "(" + variablesList + ")";
        }
        return "$let(" + functor + ": " + type->toString() + ", " + functor + variablesList + " := " + binding.toString() + ", ";
      }
      case SpecialFunctor::ITE: {
        ASS_EQ(arity(),2);
        return "$ite(" + sd->getCondition()->toString() + ", ";
      }
      case SpecialFunctor::TUPLE: {
        ASS_EQ(arity(), 0);
        Term* term = sd->getTupleTerm();
        std::string termList = "";
        Term::Iterator tit(term);
        unsigned i = term->arity();
        while (tit.hasNext()) {
          termList += tit.next().toString();
          if (--i > 0) {
            termList += ", ";
          }
        }
        return "[" + termList + "]";
      }
      case SpecialFunctor::LET_TUPLE: {
        ASS_EQ(arity(), 1);
        VList* symbols = sd->getTupleSymbols();
        unsigned tupleFunctor = sd->getFunctor();
        TermList binding = sd->getBinding();

        OperatorType* fnType = env.signature->getFunction(tupleFunctor)->fnType();

        std::string symbolsList = "";
        std::string typesList = "";
        for (unsigned i = 0; i < VList::length(symbols); i++) {
          Signature::Symbol* symbol = (fnType->arg(i) == AtomicSort::boolSort())
            ? env.signature->getPredicate(VList::nth(symbols, i))
            : env.signature->getFunction(VList::nth(symbols, i));
          symbolsList += symbol->name();
          typesList += symbol->name() + ": " + fnType->arg(i).toString();
          if (i != VList::length(symbols) - 1) {
            symbolsList += ", ";
            typesList += ", ";
          }
        }

        return "$let([" + typesList + "], [" + symbolsList + "] := " + binding.toString() + ", ";
      }
      case SpecialFunctor::LAMBDA: {
        VList* vars = sd->getLambdaVars();
        SList* sorts = sd->getLambdaVarSorts();
        TermList lambdaExp = sd->getLambdaExp();

        std::string varList = "[";

        VList::Iterator vs(vars);
        SList::Iterator ss(sorts);
        bool first = true;
        while(vs.hasNext()) {
          if (!first){
            varList += ", ";
          }else{ first = false; }
          varList += Term::variableToString(vs.next()) + " : ";
          varList += ss.next().toString();
        }
        varList += "]";
        return "(^" + varList + " : (" + lambdaExp.toString() + "))";
      }
      case SpecialFunctor::MATCH: {
        // we simply let the arguments be written out
        return "$match(";
      }
      default:
        ASSERTION_VIOLATION;
    }
  } else {
    unsigned proj;
    if (!isSort() && Theory::tuples()->findProjection(functor(), isLiteral(), proj)) {
      return "$proj(" + Int::toString(proj) + ", ";
    }
    bool print = (isLiteral() || isSort() ||
                 (env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB)) && arity();
    std::string name = "";
    if(isLiteral()) {
      name = static_cast<const Literal *>(this)->predicateName();
    } else if (isSort()) {
      const AtomicSort* asSort = static_cast<const AtomicSort *>(this);
      if(env.options->showFOOL() && asSort->isBoolSort()){
        name = "$bool";
      } else {
        name = asSort->typeConName();
      }
    } else {
      name = functionName();
    }
    return name + (print ? "(" : "");
  }
}